

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O0

void __thiscall
tchecker::parsing::location_declaration_t::location_declaration_t
          (location_declaration_t *this,location_declaration_t *param_1)

{
  location_declaration_t *param_1_local;
  location_declaration_t *this_local;
  
  inner_declaration_t::inner_declaration_t
            (&this->super_inner_declaration_t,&param_1->super_inner_declaration_t);
  (this->super_inner_declaration_t).super_declaration_t._vptr_declaration_t =
       (_func_int **)&PTR__location_declaration_t_00426418;
  std::__cxx11::string::string((string *)&this->_name,(string *)&param_1->_name);
  std::shared_ptr<const_tchecker::parsing::process_declaration_t>::shared_ptr
            (&this->_process,&param_1->_process);
  return;
}

Assistant:

location_declaration_t::location_declaration_t(tchecker::parsing::location_declaration_t &&) = default;